

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  anon_union_8_21_eb924b1f_for_Extension_0 aVar1;
  bool bVar2;
  int32 iVar3;
  FieldDescriptor *pFVar4;
  _func_int **pp_Var5;
  long *plVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar7;
  Rep *pRVar8;
  RepeatedField<bool> *this_00;
  RepeatedPtrFieldBase *this_01;
  byte bVar9;
  Extension *pEVar10;
  MessageLite *pMVar11;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar12;
  Arena *pAVar13;
  string *this_02;
  long *plVar14;
  void **our_elems;
  uint64 uVar15;
  __pointer_type pSVar16;
  size_t __n;
  int iVar17;
  RepeatedField<double> *this_03;
  RepeatedField<int> *this_04;
  long lVar18;
  void *__src;
  void *__dest;
  RepeatedField<int> *pRVar19;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar20;
  undefined1 auVar21 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (other_extension->is_repeated != true) {
    if ((other_extension->field_0xa & 1) != 0) {
      return;
    }
    bVar9 = other_extension->type;
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar9 * 4)) {
    case 1:
    case 3:
    case 8:
      iVar3 = (other_extension->field_0).int32_value;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar10 = pVar20.first;
      pEVar10->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar10->type = bVar9;
        pEVar10->is_repeated = false;
      }
      pEVar10->field_0xa = pEVar10->field_0xa & 0xf0;
      (pEVar10->field_0).int32_value = iVar3;
      return;
    case 2:
    case 4:
      aVar1 = other_extension->field_0;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar10 = pVar20.first;
      pEVar10->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar10->type = bVar9;
        pEVar10->is_repeated = false;
      }
      pEVar10->field_0xa = pEVar10->field_0xa & 0xf0;
      pEVar10->field_0 = aVar1;
      return;
    case 5:
      aVar1 = other_extension->field_0;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar10 = pVar20.first;
      pEVar10->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar10->type = bVar9;
        pEVar10->is_repeated = false;
      }
      pEVar10->field_0xa = pEVar10->field_0xa & 0xf0;
      pEVar10->field_0 = aVar1;
      return;
    case 6:
      iVar3 = (other_extension->field_0).int32_value;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar10 = pVar20.first;
      pEVar10->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar10->type = bVar9;
        pEVar10->is_repeated = false;
      }
      pEVar10->field_0xa = pEVar10->field_0xa & 0xf0;
      (pEVar10->field_0).int32_value = iVar3;
      return;
    case 7:
      bVar2 = (other_extension->field_0).bool_value;
      pFVar4 = other_extension->descriptor;
      pVar20 = Insert(this,number);
      pEVar10 = pVar20.first;
      pEVar10->descriptor = pFVar4;
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar10->type = bVar9;
        pEVar10->is_repeated = false;
      }
      pEVar10->field_0xa = pEVar10->field_0xa & 0xf0;
      (pEVar10->field_0).bool_value = bVar2;
      return;
    case 9:
      pp_Var5 = ((other_extension->field_0).message_value)->_vptr_MessageLite;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pp_Var5,
                 (long)(other_extension->field_0).message_value[1]._vptr_MessageLite + (long)pp_Var5
                );
      this_02 = MutableString_abi_cxx11_(this,number,bVar9,other_extension->descriptor);
      std::__cxx11::string::operator=((string *)this_02,(string *)local_50);
      if (local_50[0] == local_40) {
        return;
      }
      operator_delete(local_50[0]);
      return;
    case 10:
      goto switchD_002c1291_caseD_a;
    default:
      return;
    }
  }
  pFVar4 = other_extension->descriptor;
  pVar20 = Insert(this,number);
  pEVar10 = pVar20.first;
  pEVar10->descriptor = pFVar4;
  if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar10->type = other_extension->type;
    pEVar10->is_packed = other_extension->is_packed;
    pEVar10->is_repeated = true;
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)other_extension->type * 4))
  {
  case 1:
  case 8:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pMVar11 = (MessageLite *)operator_new(0x10);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation(pAVar13,(type_info *)&RepeatedField<int>::typeinfo,0x10);
        }
        pMVar11 = (MessageLite *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar13->impl_,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<int>>);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)pAVar13;
      }
      (pEVar10->field_0).message_value = pMVar11;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_04 = (pEVar10->field_0).repeated_int32_value;
    lVar18 = (long)this_04->current_size_;
    RepeatedField<int>::Reserve(this_04,pRVar19->current_size_ + this_04->current_size_);
    break;
  case 2:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pMVar11 = (MessageLite *)operator_new(0x10);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation(pAVar13,(type_info *)&RepeatedField<long>::typeinfo,0x10);
        }
        pMVar11 = (MessageLite *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar13->impl_,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<long>>);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)pAVar13;
      }
      (pEVar10->field_0).message_value = pMVar11;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_03 = (RepeatedField<double> *)(pEVar10->field_0).repeated_int64_value;
    lVar18 = (long)((RepeatedField<long> *)this_03)->current_size_;
    RepeatedField<long>::Reserve
              ((RepeatedField<long> *)this_03,
               pRVar19->current_size_ + ((RepeatedField<long> *)this_03)->current_size_);
    goto LAB_002c1877;
  case 3:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pMVar11 = (MessageLite *)operator_new(0x10);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation(pAVar13,(type_info *)&RepeatedField<unsigned_int>::typeinfo,0x10)
          ;
        }
        pMVar11 = (MessageLite *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar13->impl_,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<unsigned_int>>);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)pAVar13;
      }
      (pEVar10->field_0).message_value = pMVar11;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_04 = (RepeatedField<int> *)(pEVar10->field_0).repeated_uint32_value;
    lVar18 = (long)((RepeatedField<unsigned_int> *)this_04)->current_size_;
    RepeatedField<unsigned_int>::Reserve
              ((RepeatedField<unsigned_int> *)this_04,
               pRVar19->current_size_ + ((RepeatedField<unsigned_int> *)this_04)->current_size_);
    break;
  case 4:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pMVar11 = (MessageLite *)operator_new(0x10);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation
                    (pAVar13,(type_info *)&RepeatedField<unsigned_long>::typeinfo,0x10);
        }
        pMVar11 = (MessageLite *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar13->impl_,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<unsigned_long>>);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)pAVar13;
      }
      (pEVar10->field_0).message_value = pMVar11;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_03 = (RepeatedField<double> *)(pEVar10->field_0).repeated_uint64_value;
    lVar18 = (long)((RepeatedField<unsigned_long> *)this_03)->current_size_;
    RepeatedField<unsigned_long>::Reserve
              ((RepeatedField<unsigned_long> *)this_03,
               pRVar19->current_size_ + ((RepeatedField<unsigned_long> *)this_03)->current_size_);
    goto LAB_002c1877;
  case 5:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pMVar11 = (MessageLite *)operator_new(0x10);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation(pAVar13,(type_info *)&RepeatedField<double>::typeinfo,0x10);
        }
        pMVar11 = (MessageLite *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar13->impl_,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<double>>);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)pAVar13;
      }
      (pEVar10->field_0).message_value = pMVar11;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_03 = (pEVar10->field_0).repeated_double_value;
    lVar18 = (long)this_03->current_size_;
    RepeatedField<double>::Reserve(this_03,pRVar19->current_size_ + this_03->current_size_);
LAB_002c1877:
    ((RepeatedField<unsigned_long> *)this_03)->current_size_ =
         ((RepeatedField<unsigned_long> *)this_03)->current_size_ + pRVar19->current_size_;
    __dest = (void *)(lVar18 * 8 +
                     (long)((RepeatedField<unsigned_long> *)this_03)->arena_or_elements_);
    __src = pRVar19->arena_or_elements_;
    __n = (long)pRVar19->current_size_ << 3;
    goto LAB_002c18db;
  case 6:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pMVar11 = (MessageLite *)operator_new(0x10);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation(pAVar13,(type_info *)&RepeatedField<float>::typeinfo,0x10);
        }
        pMVar11 = (MessageLite *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar13->impl_,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<float>>);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)pAVar13;
      }
      (pEVar10->field_0).message_value = pMVar11;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_04 = (RepeatedField<int> *)(pEVar10->field_0).repeated_float_value;
    lVar18 = (long)((RepeatedField<float> *)this_04)->current_size_;
    RepeatedField<float>::Reserve
              ((RepeatedField<float> *)this_04,
               pRVar19->current_size_ + ((RepeatedField<float> *)this_04)->current_size_);
    break;
  case 7:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pMVar11 = (MessageLite *)operator_new(0x10);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation(pAVar13,(type_info *)&RepeatedField<bool>::typeinfo,0x10);
        }
        pMVar11 = (MessageLite *)
                  ArenaImpl::AllocateAlignedAndAddCleanup
                            (&pAVar13->impl_,0x10,
                             arena_destruct_object<google::protobuf::RepeatedField<bool>>);
        pMVar11->_vptr_MessageLite = (_func_int **)0x0;
        pMVar11[1]._vptr_MessageLite = (_func_int **)pAVar13;
      }
      (pEVar10->field_0).message_value = pMVar11;
    }
    pRVar19 = (other_extension->field_0).repeated_int32_value;
    if (pRVar19->current_size_ == 0) {
      return;
    }
    this_00 = (pEVar10->field_0).repeated_bool_value;
    iVar17 = this_00->current_size_;
    RepeatedField<bool>::Reserve(this_00,pRVar19->current_size_ + iVar17);
    this_00->current_size_ = this_00->current_size_ + pRVar19->current_size_;
    __dest = (void *)((long)iVar17 + (long)this_00->arena_or_elements_);
    __src = pRVar19->arena_or_elements_;
    __n = (size_t)pRVar19->current_size_;
    goto LAB_002c18db;
  case 9:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pRVar12 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x18);
        (pRVar12->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
        (pRVar12->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar12->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar12->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation
                    (pAVar13,(type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
        }
        pRVar12 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)ArenaImpl::AllocateAlignedAndAddCleanup
                               (&pAVar13->impl_,0x18,
                                arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                               );
        (pRVar12->super_RepeatedPtrFieldBase).arena_ = pAVar13;
        (pRVar12->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar12->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar12->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      (pEVar10->field_0).repeated_string_value = pRVar12;
    }
    iVar17 = (((other_extension->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).
             current_size_;
    if (iVar17 == 0) {
      return;
    }
    this_01 = &((pEVar10->field_0).repeated_string_value)->super_RepeatedPtrFieldBase;
    pRVar8 = (((other_extension->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).rep_;
    our_elems = RepeatedPtrFieldBase::InternalExtend(this_01,iVar17);
    RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (this_01,our_elems,pRVar8->elements,iVar17,
               this_01->rep_->allocated_size - this_01->current_size_);
    iVar17 = iVar17 + this_01->current_size_;
    this_01->current_size_ = iVar17;
    if (iVar17 <= this_01->rep_->allocated_size) {
      return;
    }
    this_01->rep_->allocated_size = iVar17;
    return;
  case 10:
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pAVar13 = this->arena_;
      if (pAVar13 == (Arena *)0x0) {
        pRVar12 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x18);
        (pRVar12->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
        (pRVar12->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar12->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar12->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      else {
        if (pAVar13->hooks_cookie_ != (void *)0x0) {
          Arena::OnArenaAllocation
                    (pAVar13,(type_info *)&RepeatedPtrField<google::protobuf::MessageLite>::typeinfo
                     ,0x18);
        }
        pRVar12 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)ArenaImpl::AllocateAlignedAndAddCleanup
                               (&pAVar13->impl_,0x18,
                                arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                               );
        (pRVar12->super_RepeatedPtrFieldBase).arena_ = pAVar13;
        (pRVar12->super_RepeatedPtrFieldBase).current_size_ = 0;
        (pRVar12->super_RepeatedPtrFieldBase).total_size_ = 0;
        (pRVar12->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      }
      (pEVar10->field_0).repeated_string_value = pRVar12;
    }
    pRVar12 = (other_extension->field_0).repeated_string_value;
    if (0 < (pRVar12->super_RepeatedPtrFieldBase).current_size_) {
      lVar18 = 0;
      do {
        plVar6 = (long *)((pRVar12->super_RepeatedPtrFieldBase).rep_)->elements[lVar18];
        pRVar7 = (pEVar10->field_0).repeated_string_value;
        pRVar8 = (pRVar7->super_RepeatedPtrFieldBase).rep_;
        if (pRVar8 == (Rep *)0x0) {
LAB_002c1750:
          plVar14 = (long *)0x0;
        }
        else {
          iVar17 = (pRVar7->super_RepeatedPtrFieldBase).current_size_;
          if (pRVar8->allocated_size <= iVar17) goto LAB_002c1750;
          (pRVar7->super_RepeatedPtrFieldBase).current_size_ = iVar17 + 1;
          plVar14 = (long *)pRVar8->elements[iVar17];
        }
        if (plVar14 == (long *)0x0) {
          plVar14 = (long *)(**(code **)(*plVar6 + 0x20))(plVar6,this->arena_);
          RepeatedPtrFieldBase::
          AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                    ((RepeatedPtrFieldBase *)(pEVar10->field_0).int64_value,plVar14);
        }
        (**(code **)(*plVar14 + 0x50))(plVar14,plVar6);
        lVar18 = lVar18 + 1;
      } while (lVar18 < (pRVar12->super_RepeatedPtrFieldBase).current_size_);
    }
  default:
    return;
  }
  this_04->current_size_ = this_04->current_size_ + pRVar19->current_size_;
  __dest = (void *)(lVar18 * 4 + (long)this_04->arena_or_elements_);
  __src = pRVar19->arena_or_elements_;
  __n = (long)pRVar19->current_size_ << 2;
LAB_002c18db:
  memcpy(__dest,__src,__n);
  return;
switchD_002c1291_caseD_a:
  pFVar4 = other_extension->descriptor;
  pVar20 = Insert(this,number);
  pEVar10 = pVar20.first;
  pEVar10->descriptor = pFVar4;
  if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pAVar13 = (Arena *)(pEVar10->field_0).repeated_string_value;
    pRVar12 = (other_extension->field_0).repeated_string_value;
    if ((other_extension->field_0xa & 0x10) == 0) {
      pSVar16 = (pAVar13->impl_).threads_._M_b._M_p;
      if ((pEVar10->field_0xa & 0x10) == 0) {
        (*(code *)pSVar16[1].owner_)(pAVar13,(size_t)pRVar12);
        goto LAB_002c19ac;
      }
      pAVar13 = (Arena *)(*(code *)pSVar16->next_)();
      goto LAB_002c19a0;
    }
    if ((pEVar10->field_0xa & 0x10) != 0) {
      (*(code *)(pAVar13->impl_).threads_._M_b._M_p[1].next_)(pAVar13,pRVar12,pVar20._8_8_);
      goto LAB_002c19ac;
    }
    uVar15 = (*(code *)(((pRVar12->super_RepeatedPtrFieldBase).arena_)->impl_).initial_block_)
                       (pRVar12,pAVar13);
    pSVar16 = (pAVar13->impl_).threads_._M_b._M_p;
  }
  else {
    pEVar10->type = other_extension->type;
    pEVar10->is_packed = other_extension->is_packed;
    pEVar10->is_repeated = false;
    bVar9 = pEVar10->field_0xa & 0xf;
    if ((other_extension->field_0xa & 0x10) != 0) {
      pEVar10->field_0xa = bVar9 | 0x10;
      auVar21 = (*(code *)(((((other_extension->field_0).repeated_string_value)->
                            super_RepeatedPtrFieldBase).arena_)->impl_).space_allocated_.
                          super___atomic_base<unsigned_long>._M_i)
                          ((other_extension->field_0).repeated_string_value,this->arena_);
      pAVar13 = auVar21._0_8_;
      (pEVar10->field_0).repeated_string_value =
           (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)pAVar13;
      (*(code *)(pAVar13->impl_).threads_._M_b._M_p[1].next_)
                (pAVar13,(other_extension->field_0).string_value,auVar21._8_8_);
      goto LAB_002c19ac;
    }
    pEVar10->field_0xa = bVar9;
    pAVar13 = (Arena *)(*(code *)(((((other_extension->field_0).repeated_string_value)->
                                   super_RepeatedPtrFieldBase).arena_)->impl_).lifecycle_id_)
                                 ((other_extension->field_0).repeated_string_value,this->arena_);
    (pEVar10->field_0).repeated_string_value =
         (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)pAVar13;
LAB_002c19a0:
    uVar15 = (other_extension->field_0).uint64_value;
    pSVar16 = (pAVar13->impl_).threads_._M_b._M_p;
  }
  (*(code *)pSVar16[1].owner_)(pAVar13,uVar15);
LAB_002c19ac:
  pEVar10->field_0xa = pEVar10->field_0xa & 0xf0;
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
    int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new =
        MaybeNewExtension(number, other_extension.descriptor, &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE) \
  case WireFormatLite::CPPTYPE_##UPPERCASE:              \
    if (is_new) {                                        \
      extension->repeated_##LOWERCASE##_value =          \
          Arena::CreateMessage<REPEATED_TYPE>(arena_);   \
    }                                                    \
    extension->repeated_##LOWERCASE##_value->MergeFrom(  \
        *other_extension.repeated_##LOWERCASE##_value);  \
    break;

      HANDLE_TYPE(INT32, int32, RepeatedField<int32>);
      HANDLE_TYPE(INT64, int64, RepeatedField<int64>);
      HANDLE_TYPE(UINT32, uint32, RepeatedField<uint32>);
      HANDLE_TYPE(UINT64, uint64, RepeatedField<uint64>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target =
              reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                  extension->repeated_message_value)
                  ->AddFromCleared<GenericTypeHandler<MessageLite>>();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)  \
  case WireFormatLite::CPPTYPE_##UPPERCASE:           \
    Set##CAMELCASE(number, other_extension.type,      \
                   other_extension.LOWERCASE##_value, \
                   other_extension.descriptor);       \
    break;

        HANDLE_TYPE(INT32, int32, Int32);
        HANDLE_TYPE(INT64, int64, Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE(FLOAT, float, Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(BOOL, bool, Bool);
        HANDLE_TYPE(ENUM, enum, Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type, *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new =
              MaybeNewExtension(number, other_extension.descriptor, &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value
                    ->MutableMessage(*other_extension.message_value)
                    ->CheckTypeAndMergeFrom(*other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}